

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::setDecimalFormatSymbols(DecimalFormat *this,DecimalFormatSymbols *symbols)

{
  DecimalFormatFields *pDVar1;
  DecimalFormatSymbols *this_00;
  DecimalFormatSymbols *local_38;
  DecimalFormatSymbols *symbols_local;
  DecimalFormat *this_local;
  
  pDVar1 = this->fields;
  this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)symbols);
  local_38 = (DecimalFormatSymbols *)0x0;
  if (this_00 != (DecimalFormatSymbols *)0x0) {
    DecimalFormatSymbols::DecimalFormatSymbols(this_00,symbols);
    local_38 = this_00;
  }
  LocalPointer<const_icu_63::DecimalFormatSymbols>::adoptInstead(&pDVar1->symbols,local_38);
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setDecimalFormatSymbols(const DecimalFormatSymbols& symbols) {
    fields->symbols.adoptInstead(new DecimalFormatSymbols(symbols));
    touchNoError();
}